

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O3

FormulaUnit * Shell::Flattening::flatten(FormulaUnit *unit)

{
  Formula *f;
  Formula *pFVar1;
  FormulaUnit *this;
  ostream *poVar2;
  undefined1 local_98 [32];
  void *local_78;
  float fStack_70;
  float fStack_6c;
  char *local_60;
  size_type sStack_58;
  SplitSet *local_50;
  void *pvStack_48;
  void *local_40;
  float fStack_38;
  float fStack_34;
  FormulaClauseTransformation local_30;
  
  f = unit->_formula;
  pFVar1 = flatten(f);
  this = unit;
  if (f != pFVar1) {
    this = (FormulaUnit *)::operator_new(0x48,8);
    local_30.rule = FLATTEN;
    local_30.premise = &unit->super_Unit;
    Kernel::Inference::Inference((Inference *)&local_60,&local_30);
    local_78 = local_40;
    fStack_70 = fStack_38;
    fStack_6c = fStack_34;
    local_98._16_8_ = local_50;
    local_98._24_8_ = pvStack_48;
    local_98._0_8_ = local_60;
    local_98._8_8_ = sStack_58;
    Kernel::Unit::Unit((Unit *)this,FORMULA,(Inference *)local_98);
    this->_formula = pFVar1;
    this->_cachedColor = COLOR_INVALID;
    this->_cachedWeight = 0;
    Kernel::Unit::doUnitTracing((Unit *)this);
    if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa1d2) & 1) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[PP] flatten in: ",0x11);
      Kernel::FormulaUnit::toString_abi_cxx11_((string *)local_98,unit);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[PP] flatten out: ",0x12);
      Kernel::FormulaUnit::toString_abi_cxx11_((string *)local_98,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
    }
  }
  return this;
}

Assistant:

FormulaUnit* Flattening::flatten (FormulaUnit* unit)
{
  ASS(! unit->isClause());

  Formula* f = unit->formula();
  Formula* g = flatten(f);
  if (f == g) { // not changed
    return unit;
  }

  FormulaUnit* res = new FormulaUnit(g,
      FormulaClauseTransformation(InferenceRule::FLATTEN,unit));
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] flatten in: " << unit->toString() << std::endl;
    std::cout << "[PP] flatten out: " << res->toString() << std::endl;
  }
  return res;
}